

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshSimplify.cpp
# Opt level: O2

void __thiscall MeshSimplify::output(MeshSimplify *this)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  VertexGroup *pVVar4;
  ulong uVar5;
  int iVar6;
  _Self __tmp;
  long lVar7;
  int i;
  long lVar8;
  
  iVar6 = 0;
  lVar8 = 1;
  lVar7 = 0x68;
  while( true ) {
    pVVar4 = this->vGroup;
    uVar5 = (ulong)pVVar4->cntVertex;
    if ((long)uVar5 < lVar8) break;
    if (pVVar4->isDeleted[lVar8] == false) {
      iVar6 = iVar6 + 1;
      *(int *)((long)pVVar4 + lVar7 + -0x18) = iVar6;
      printf("v %lf %lf %lf\n",*(undefined8 *)((long)pVVar4 + lVar7 + -0x10),
             *(undefined8 *)((long)pVVar4 + lVar7 + -8),*(undefined8 *)(&pVVar4->field_0x0 + lVar7))
      ;
    }
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x50;
  }
  for (lVar8 = 1; lVar8 <= (int)uVar5; lVar8 = lVar8 + 1) {
    if (pVVar4->isDeleted[lVar8] == false) {
      lVar7 = lVar8 * 0x50;
      for (p_Var3 = *(_Rb_tree_node_base **)(&pVVar4->field_0x38 + lVar7);
          p_Var3 != (_Rb_tree_node_base *)(&pVVar4->field_0x28 + lVar7);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        if (lVar8 < (int)p_Var3[1]._M_color) {
          for (p_Var2 = *(_Rb_tree_node_base **)((long)(&pVVar4->field_0x0 + lVar7) + 0x38);
              p_Var2 != (_Rb_tree_node_base *)(&pVVar4->field_0x28 + lVar7);
              p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
            if ((int)p_Var3[1]._M_color < (int)p_Var2[1]._M_color) {
              bVar1 = Vertex::hasNeighborVertex
                                ((Vertex *)
                                 (&this->vGroup->field_0x0 + (long)(int)p_Var3[1]._M_color * 0x50),
                                 p_Var2[1]._M_color);
              if (bVar1) {
                printf("f %d %d %d\n",(ulong)*(uint *)(&pVVar4->field_0x0 + lVar7),
                       (ulong)*(uint *)(&this->vGroup->field_0x0 +
                                       (long)(int)p_Var3[1]._M_color * 0x50),
                       (ulong)*(uint *)(&this->vGroup->field_0x0 +
                                       (long)(int)p_Var2[1]._M_color * 0x50));
              }
            }
          }
        }
      }
      pVVar4 = this->vGroup;
      uVar5 = (ulong)(uint)pVVar4->cntVertex;
    }
  }
  return;
}

Assistant:

void MeshSimplify::output(){
	int cnt = 0;
	int cntv=0,cntf=0;
	for(int i = 1;i <= vGroup->cntVertex;i++){
		if(vGroup->isDeleted[i])
			continue;
		Vertex* v = &vGroup->group[i];
		cnt++;
		v->id = cnt;
		printf("v %lf %lf %lf\n",v->pos.x,v->pos.y,v->pos.z);
	}	
	for(int i = 1;i <= vGroup->cntVertex;i++){
		if(vGroup->isDeleted[i])
			continue;
		Vertex* v = &(vGroup->group[i]);
		for(set<int>::iterator it1 = v->neighborVertexIds.begin();it1 != v->neighborVertexIds.end();it1++){
			if(i >= (*it1))
				continue;
			for(set<int>::iterator it2 = v->neighborVertexIds.begin();it2 != v->neighborVertexIds.end();it2++){
				if((*it1) < (*it2) && (vGroup->group[(*it1)].hasNeighborVertex(*it2))){
					printf("f %d %d %d\n",v->id,vGroup->group[(*it1)].id,vGroup->group[(*it2)].id);
					cntf++;
				}	
			}
		}

	}
}